

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapchecker.cpp
# Opt level: O3

void __thiscall CMapChecker::AddMaplist(CMapChecker *this,CMapVersion *pMaplist,int Num)

{
  uint uVar1;
  CWhitelistEntry *dst;
  ulong uVar2;
  
  if (this->m_ClearListBeforeAdding == true) {
    CHeap::Reset(&this->m_Whitelist);
    this->m_pFirst = (CWhitelistEntry *)0x0;
    this->m_ClearListBeforeAdding = false;
  }
  if (0 < Num) {
    uVar2 = (ulong)(uint)Num;
    do {
      dst = (CWhitelistEntry *)CHeap::Allocate(&this->m_Whitelist,0x38);
      dst->m_pNext = this->m_pFirst;
      this->m_pFirst = dst;
      str_copy((char *)dst,pMaplist->m_aName,8);
      uVar1 = bytes_be_to_uint(pMaplist->m_aCrc);
      dst->m_MapCrc = uVar1;
      uVar1 = bytes_be_to_uint(pMaplist->m_aSize);
      dst->m_MapSize = uVar1;
      mem_copy(&dst->m_MapSha256,pMaplist->m_aSha256,0x20);
      pMaplist = pMaplist + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void CMapChecker::AddMaplist(const CMapVersion *pMaplist, int Num)
{
	if(m_ClearListBeforeAdding)
		Init();

	for(int i = 0; i < Num; ++i)
	{
		CWhitelistEntry *pEntry = (CWhitelistEntry *)m_Whitelist.Allocate(sizeof(CWhitelistEntry));
		pEntry->m_pNext = m_pFirst;
		m_pFirst = pEntry;

		str_copy(pEntry->m_aMapName, pMaplist[i].m_aName, sizeof(pEntry->m_aMapName));
		pEntry->m_MapCrc = bytes_be_to_uint(pMaplist[i].m_aCrc);
		pEntry->m_MapSize = bytes_be_to_uint(pMaplist[i].m_aSize);
		mem_copy(&pEntry->m_MapSha256, &pMaplist[i].m_aSha256, sizeof(pEntry->m_MapSha256));
	}
}